

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCrypto_openssl.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_b126ba::RC4Loader::RC4Loader(RC4Loader *this)

{
  OSSL_LIB_CTX *pOVar1;
  OSSL_PROVIDER *pOVar2;
  EVP_CIPHER *pEVar3;
  runtime_error *this_00;
  
  pOVar1 = (OSSL_LIB_CTX *)OSSL_LIB_CTX_new();
  this->libctx = pOVar1;
  if (pOVar1 == (OSSL_LIB_CTX *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unable to create openssl library context");
  }
  else {
    pOVar2 = (OSSL_PROVIDER *)OSSL_PROVIDER_load(pOVar1,"legacy");
    this->legacy = pOVar2;
    if (pOVar2 == (OSSL_PROVIDER *)0x0) {
      OSSL_LIB_CTX_free(this->libctx);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"unable to load openssl legacy provider");
    }
    else {
      pEVar3 = (EVP_CIPHER *)EVP_CIPHER_fetch(this->libctx,"RC4",0);
      this->rc4 = pEVar3;
      if (pEVar3 != (EVP_CIPHER *)0x0) {
        return;
      }
      OSSL_PROVIDER_unload(this->legacy);
      OSSL_LIB_CTX_free(this->libctx);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"unable to load openssl rc4 algorithm");
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RC4Loader::RC4Loader()
{
    libctx = OSSL_LIB_CTX_new();
    if (libctx == nullptr) {
        throw std::runtime_error("unable to create openssl library context");
        return;
    }
    legacy = OSSL_PROVIDER_load(libctx, "legacy");
    if (legacy == nullptr) {
        OSSL_LIB_CTX_free(libctx);
        throw std::runtime_error("unable to load openssl legacy provider");
        return;
    }
    rc4 = EVP_CIPHER_fetch(libctx, "RC4", nullptr);
    if (rc4 == nullptr) {
        OSSL_PROVIDER_unload(legacy);
        OSSL_LIB_CTX_free(libctx);
        throw std::runtime_error("unable to load openssl rc4 algorithm");
        return;
    }
}